

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-utf8.cc
# Opt level: O0

void __thiscall utf8_valid_4_bytes_Test::TestBody(utf8_valid_4_bytes_Test *this)

{
  bool bVar1;
  undefined1 local_22;
  undefined4 local_20;
  int iStack_1c;
  bool is_valid;
  int cu3;
  int cu2;
  int cu1;
  int cu0;
  utf8_valid_4_bytes_Test *this_local;
  
  for (cu2 = 0xf1; cu2 < 0xf4; cu2 = cu2 + 1) {
    for (cu3 = 0; cu3 < 0x100; cu3 = cu3 + 1) {
      for (iStack_1c = 0; iStack_1c < 0x100; iStack_1c = iStack_1c + 1) {
        for (local_20 = 0; local_20 < 0x100; local_20 = local_20 + 1) {
          bVar1 = anon_unknown.dwarf_9556a::is_in_range(cu3,0x80,0xc0);
          local_22 = false;
          if (bVar1) {
            bVar1 = anon_unknown.dwarf_9556a::is_in_range(iStack_1c,0x80,0xc0);
            local_22 = false;
            if (bVar1) {
              local_22 = anon_unknown.dwarf_9556a::is_in_range(local_20,0x80,0xc0);
            }
          }
          anon_unknown.dwarf_9556a::assert_is_valid_utf8(local_22,4,cu2,cu3,iStack_1c,local_20);
        }
      }
    }
  }
  return;
}

Assistant:

TEST(utf8, valid_4_bytes) {
  FOR_RANGE(cu0, 0xf1, 0xf4) {
    FOR_EACH_BYTE(cu1) {
      FOR_EACH_BYTE(cu2) {
        FOR_EACH_BYTE(cu3) {
          bool is_valid = is_in_range(cu1, 0x80, 0xc0) &&
                          is_in_range(cu2, 0x80, 0xc0) &&
                          is_in_range(cu3, 0x80, 0xc0);
          assert_is_valid_utf8(is_valid, 4, cu0, cu1, cu2, cu3);
        }
      }
    }
  }
}